

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_write_local_date_time(mg_session *session,mg_local_date_time *ldt)

{
  int iVar1;
  char local_1a [2];
  
  local_1a[0] = -0x4e;
  iVar1 = mg_session_write_raw(session,local_1a,1);
  if (iVar1 == 0) {
    local_1a[1] = 100;
    iVar1 = mg_session_write_raw(session,local_1a + 1,1);
    if ((iVar1 == 0) && (iVar1 = mg_session_write_integer(session,ldt->seconds), iVar1 == 0)) {
      iVar1 = mg_session_write_integer(session,ldt->nanoseconds);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_write_local_date_time(mg_session *session,
                                     const mg_local_date_time *ldt) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT2)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_LOCAL_DATE_TIME));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, ldt->seconds));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, ldt->nanoseconds));
  return 0;
}